

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

void duckdb::QuantileOperation::Destroy<duckdb::QuantileState<short,duckdb::QuantileStandardType>>
               (QuantileState<short,_duckdb::QuantileStandardType> *state,
               AggregateInputData *param_2)

{
  _Head_base<0UL,_duckdb::QuantileCursor<short>_*,_false> __ptr;
  _Head_base<0UL,_duckdb::WindowQuantileState<short>_*,_false> __ptr_00;
  pointer psVar1;
  
  __ptr._M_head_impl =
       (state->window_cursor).
       super_unique_ptr<duckdb::QuantileCursor<short>,_std::default_delete<duckdb::QuantileCursor<short>_>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::QuantileCursor<short>,_std::default_delete<duckdb::QuantileCursor<short>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::QuantileCursor<short>_*,_std::default_delete<duckdb::QuantileCursor<short>_>_>
       .super__Head_base<0UL,_duckdb::QuantileCursor<short>_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (QuantileCursor<short> *)0x0) {
    ::std::default_delete<duckdb::QuantileCursor<short>_>::operator()
              ((default_delete<duckdb::QuantileCursor<short>_> *)&state->window_cursor,
               __ptr._M_head_impl);
  }
  (state->window_cursor).
  super_unique_ptr<duckdb::QuantileCursor<short>,_std::default_delete<duckdb::QuantileCursor<short>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::QuantileCursor<short>,_std::default_delete<duckdb::QuantileCursor<short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::QuantileCursor<short>_*,_std::default_delete<duckdb::QuantileCursor<short>_>_>
  .super__Head_base<0UL,_duckdb::QuantileCursor<short>_*,_false>._M_head_impl =
       (QuantileCursor<short> *)0x0;
  __ptr_00._M_head_impl =
       (state->window_state).
       super_unique_ptr<duckdb::WindowQuantileState<short>,_std::default_delete<duckdb::WindowQuantileState<short>_>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::WindowQuantileState<short>,_std::default_delete<duckdb::WindowQuantileState<short>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowQuantileState<short>_*,_std::default_delete<duckdb::WindowQuantileState<short>_>_>
       .super__Head_base<0UL,_duckdb::WindowQuantileState<short>_*,_false>._M_head_impl;
  if (__ptr_00._M_head_impl != (WindowQuantileState<short> *)0x0) {
    ::std::default_delete<duckdb::WindowQuantileState<short>_>::operator()
              ((default_delete<duckdb::WindowQuantileState<short>_> *)&state->window_state,
               __ptr_00._M_head_impl);
  }
  (state->window_state).
  super_unique_ptr<duckdb::WindowQuantileState<short>,_std::default_delete<duckdb::WindowQuantileState<short>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowQuantileState<short>,_std::default_delete<duckdb::WindowQuantileState<short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowQuantileState<short>_*,_std::default_delete<duckdb::WindowQuantileState<short>_>_>
  .super__Head_base<0UL,_duckdb::WindowQuantileState<short>_*,_false>._M_head_impl =
       (WindowQuantileState<short> *)0x0;
  psVar1 = (state->v).super_vector<short,_std::allocator<short>_>.
           super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1);
    return;
  }
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &) {
		state.~STATE();
	}